

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.h
# Opt level: O3

string * convertNumberToString(string *__return_storage_ptr__,string *input)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_type sVar4;
  pointer pcVar5;
  invalid_argument *this;
  undefined8 uVar6;
  pointer pbVar7;
  size_type sVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar4 = input->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (input->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      cVar3 = pcVar5[sVar8];
      uVar1 = (int)cVar3 - 0x30;
      if (uVar1 < 10) {
        uVar9 = (ulong)uVar1;
        if ((ulong)((long)spelledDigits_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)spelledDigits_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar9) {
LAB_00102836:
          uVar6 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((char)sVar8 != '\0') {
            __cxa_free_exception(sVar4);
          }
          pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar2) {
            operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar6);
        }
        pbVar7 = spelledDigits_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar9;
      }
      else {
        if (cVar3 != '.') {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,input," is not a valid number!");
          std::invalid_argument::invalid_argument(this,(string *)&local_50);
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        if ((ulong)((long)spelledDigits_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)spelledDigits_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) < 0xb) {
          uVar9 = 10;
          goto LAB_00102836;
        }
        pbVar7 = spelledDigits_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10;
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar7->_M_dataplus)._M_p);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar8 = sVar8 + 1;
    } while (sVar4 != sVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertNumberToString(const std::string& input)
{
	std::string result{};
	constexpr auto dotPosition = 10;
	for (auto&& c : input)
	{
		if (std::isdigit(c))
			result += spelledDigits.at(c - '0');
		else if (c == '.')
			result += spelledDigits.at(dotPosition);
		else
			throw std::invalid_argument(input + " is not a valid number!");
		result += ' ';
	}
	return result;
}